

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

SDL_Surface * GPU_CopySurfaceFromTarget(GPU_Target *target)

{
  SDL_Surface *pSVar1;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    if (((target != (GPU_Target *)0x0) &&
        (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) &&
       (target->context != (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      pSVar1 = (*_gpu_current_renderer->impl->CopySurfaceFromTarget)(_gpu_current_renderer,target);
      return pSVar1;
    }
  }
  return (SDL_Surface *)0x0;
}

Assistant:

SDL_Surface* GPU_CopySurfaceFromTarget(GPU_Target* target)
{
    if(_gpu_current_renderer == NULL)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return NULL;

    return _gpu_current_renderer->impl->CopySurfaceFromTarget(_gpu_current_renderer, target);
}